

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

int Edg_ManEvalEdgeDelayR(Gia_Man_t *p)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *pVVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  int *piVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  size_t __size;
  ulong uVar14;
  
  if ((p->vEdge1 == (Vec_Int_t *)0x0) || (p->vEdge2 == (Vec_Int_t *)0x0)) {
    __assert_fail("p->vEdge1 && p->vEdge2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                  ,0x2e0,"int Edg_ManEvalEdgeDelayR(Gia_Man_t *)");
  }
  pVVar10 = p->vEdgeDelayR;
  uVar8 = p->nObjs;
  if (pVVar10 == (Vec_Int_t *)0x0) {
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    uVar11 = 0x10;
    if (0xe < uVar8 - 1) {
      uVar11 = uVar8;
    }
    pVVar10->nSize = 0;
    pVVar10->nCap = uVar11;
    if (uVar11 == 0) {
      piVar9 = (int *)0x0;
    }
    else {
      piVar9 = (int *)malloc((long)(int)uVar11 << 2);
    }
    pVVar10->pArray = piVar9;
    pVVar10->nSize = uVar8;
    if (piVar9 != (int *)0x0) {
      memset(piVar9,0,(long)(int)uVar8 << 2);
    }
    p->vEdgeDelayR = pVVar10;
  }
  else {
    if (pVVar10->nCap < (int)uVar8) {
      __size = (long)(int)uVar8 << 2;
      if (pVVar10->pArray == (int *)0x0) {
        piVar9 = (int *)malloc(__size);
      }
      else {
        piVar9 = (int *)realloc(pVVar10->pArray,__size);
      }
      pVVar10->pArray = piVar9;
      if (piVar9 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar10->nCap = uVar8;
    }
    if (0 < (int)uVar8) {
      memset(pVVar10->pArray,0,(ulong)uVar8 * 4);
    }
    pVVar10->nSize = uVar8;
  }
  uVar8 = 0;
  if (1 < (long)p->nObjs) {
    pVVar4 = p->vMapping2;
    uVar8 = 0;
    lVar12 = (long)p->nObjs;
    do {
      if (pVVar4->nSize < lVar12) {
LAB_001fb03f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar1 = lVar12 + -1;
      uVar11 = uVar8;
      if (pVVar4->pArray[lVar1].nSize != 0) {
        if (p->vFanouts2->nSize < lVar12) goto LAB_001fb03f;
        pVVar10 = p->vEdgeDelayR;
        pVVar5 = p->vFanouts2->pArray;
        uVar2 = pVVar5[lVar1].nSize;
        uVar11 = 0;
        uVar7 = uVar2;
        if ((int)uVar2 < 1) {
          uVar7 = 0;
        }
        if (0 < (int)uVar2) {
          uVar2 = pVVar5[lVar1].nSize;
          if (pVVar5[lVar1].nSize < 1) {
            uVar2 = uVar11;
          }
          uVar14 = 0;
          do {
            if (uVar2 == uVar14) {
LAB_001fb020:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar3 = pVVar5[lVar1].pArray[uVar14];
            if ((((long)iVar3 < 0) || (pVVar10->nSize <= iVar3)) || (p->vEdge1->nSize < lVar12))
            goto LAB_001fb020;
            uVar13 = 0;
            if (p->vEdge1->pArray[lVar1] != iVar3) {
              if (p->vEdge2->nSize < lVar12) goto LAB_001fb020;
              uVar13 = (uint)(p->vEdge2->pArray[lVar1] != iVar3);
            }
            uVar13 = uVar13 + pVVar10->pArray[iVar3];
            if ((int)uVar11 <= (int)uVar13) {
              uVar11 = uVar13;
            }
            uVar14 = uVar14 + 1;
          } while (uVar7 != uVar14);
        }
        if (pVVar10->nSize < lVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar10->pArray[lVar1] = uVar11;
        if ((int)uVar11 < (int)uVar8) {
          uVar11 = uVar8;
        }
      }
      uVar8 = uVar11;
      bVar6 = 2 < lVar12;
      lVar12 = lVar1;
    } while (bVar6);
  }
  return uVar8;
}

Assistant:

int Edg_ManEvalEdgeDelayR( Gia_Man_t * p )
{
//    int k, DelayNoEdge = 1;
    int iLut, Delay, DelayMax = 0;
    assert( p->vEdge1 && p->vEdge2 );
    if ( p->vEdgeDelayR == NULL )
        p->vEdgeDelayR = Vec_IntStart( Gia_ManObjNum(p) );
    else
        Vec_IntFill( p->vEdgeDelayR, Gia_ManObjNum(p), 0 );
//    Gia_ManForEachCoDriverId( p, iLut, k )
//        Vec_IntWriteEntry( p->vEdgeDelayR, iLut, DelayNoEdge );
    Gia_ManForEachLut2Reverse( p, iLut )
    {
        Delay = Edg_ObjEvalEdgeDelayR(p, iLut, p->vEdgeDelayR);
        Vec_IntWriteEntry( p->vEdgeDelayR, iLut, Delay );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    return DelayMax;
}